

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtrace.c
# Opt level: O1

int libtest_debug_cb(CURL *handle,curl_infotype type,uchar *data,size_t size,void *userp)

{
  int iVar1;
  FILE *__stream;
  uchar uVar2;
  time_t tVar3;
  tm *ptVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uchar *puVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  timeval tVar13;
  char timebuf [20];
  time_t secs;
  undefined1 local_58 [32];
  long local_38;
  
  local_58[0] = 0;
  if (*userp != 0) {
    tVar13 = tutil_tvnow();
    if (known_offset == '\0') {
      tVar3 = time((time_t *)0x0);
      epoch_offset = tVar3 - tVar13.tv_sec;
      known_offset = '\x01';
    }
    local_38 = epoch_offset + tVar13.tv_sec;
    ptVar4 = localtime(&local_38);
    curl_msnprintf(local_58,0x14,"%02d:%02d:%02d.%06ld ",ptVar4->tm_hour,ptVar4->tm_min,
                   ptVar4->tm_sec,tVar13.tv_usec);
  }
  __stream = _stderr;
  switch(type) {
  case CURLINFO_TEXT:
    curl_mfprintf(_stderr,"%s== Info: %s",local_58,data);
    return 0;
  case CURLINFO_HEADER_IN:
    pcVar5 = "<= Recv header";
    break;
  case CURLINFO_HEADER_OUT:
    pcVar5 = "=> Send header";
    break;
  case CURLINFO_DATA_IN:
    pcVar5 = "<= Recv data";
    break;
  case CURLINFO_DATA_OUT:
    pcVar5 = "=> Send data";
    break;
  case CURLINFO_SSL_DATA_IN:
    pcVar5 = "<= Recv SSL data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    pcVar5 = "=> Send SSL data";
    break;
  default:
    goto switchD_001028c4_default;
  }
  iVar1 = *(int *)((long)userp + 4);
  curl_mfprintf(_stderr,"%s%s, %d bytes (0x%x)\n",local_58,pcVar5,size & 0xffffffff,
                size & 0xffffffff);
  if (size != 0) {
    uVar6 = 0xffffffffffffffc0;
    if (iVar1 == 0) {
      uVar6 = 0xfffffffffffffff0;
    }
    lVar7 = 0x40;
    if (iVar1 == 0) {
      lVar7 = 0x10;
    }
    uVar10 = 0;
    do {
      curl_mfprintf(__stream,"%04x: ",uVar10 & 0xffffffff);
      uVar8 = uVar10;
      lVar12 = lVar7;
      if (iVar1 == 0) {
        do {
          if (uVar8 < size) {
            curl_mfprintf(__stream,"%02x ",data[uVar8]);
          }
          else {
            fputs("   ",__stream);
          }
          lVar12 = lVar12 + -1;
          uVar8 = uVar8 + 1;
        } while (lVar12 != 0);
      }
      lVar12 = 0;
      uVar8 = uVar6 ^ 0xfffffffffffffffe;
      puVar9 = data;
      uVar11 = uVar6 ^ 0xfffffffffffffffd;
      do {
        if (size <= uVar10 + lVar12) break;
        if (iVar1 == 0) {
          uVar2 = puVar9[uVar10];
          if ((char)uVar2 < ' ') {
            uVar2 = '.';
          }
          curl_mfprintf(__stream,"%c",uVar2);
        }
        else {
          if (((uVar10 + lVar12 + 1 < size) && (puVar9[uVar10] == '\r')) &&
             (puVar9[uVar10 + 1] == '\n')) {
            uVar10 = uVar10 - uVar8;
            break;
          }
          uVar2 = puVar9[uVar10];
          if ((char)uVar2 < ' ') {
            uVar2 = '.';
          }
          curl_mfprintf(__stream,"%c",uVar2);
          if (((uVar10 + lVar12 + 2 < size) && (puVar9[uVar10 + 1] == '\r')) &&
             (puVar9[uVar10 + 2] == '\n')) {
            uVar10 = uVar10 - uVar11;
            break;
          }
        }
        lVar12 = lVar12 + 1;
        uVar11 = uVar11 - 1;
        uVar8 = uVar8 - 1;
        puVar9 = puVar9 + 1;
      } while (lVar7 != lVar12);
      fputc(10,__stream);
      uVar10 = uVar10 + lVar7;
    } while (uVar10 < size);
  }
  fflush(__stream);
switchD_001028c4_default:
  return 0;
}

Assistant:

int libtest_debug_cb(CURL *handle, curl_infotype type,
                     unsigned char *data, size_t size,
                     void *userp)
{

  struct libtest_trace_cfg *trace_cfg = userp;
  const char *text;
  struct timeval tv;
  struct tm *now;
  char timebuf[20];
  char *timestr;
  time_t secs;

  (void)handle;

  timebuf[0] = '\0';
  timestr = &timebuf[0];

  if(trace_cfg->tracetime) {
    tv = tutil_tvnow();
    if(!known_offset) {
      epoch_offset = time(NULL) - tv.tv_sec;
      known_offset = 1;
    }
    secs = epoch_offset + tv.tv_sec;
    now = localtime(&secs);  /* not thread safe but we don't care */
    snprintf(timebuf, sizeof(timebuf), "%02d:%02d:%02d.%06ld ",
             now->tm_hour, now->tm_min, now->tm_sec, (long)tv.tv_usec);
  }

  switch(type) {
  case CURLINFO_TEXT:
    fprintf(stderr, "%s== Info: %s", timestr, (char *)data);
  default: /* in case a new one is introduced to shock us */
    return 0;

  case CURLINFO_HEADER_OUT:
    text = "=> Send header";
    break;
  case CURLINFO_DATA_OUT:
    text = "=> Send data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    text = "=> Send SSL data";
    break;
  case CURLINFO_HEADER_IN:
    text = "<= Recv header";
    break;
  case CURLINFO_DATA_IN:
    text = "<= Recv data";
    break;
  case CURLINFO_SSL_DATA_IN:
    text = "<= Recv SSL data";
    break;
  }

  libtest_debug_dump(timebuf, text, stderr, data, size, trace_cfg->nohex);
  return 0;
}